

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

AsmJsVarBase * __thiscall
Js::AsmJsFunc::DefineVar(AsmJsFunc *this,PropertyName name,bool isArg,bool isMutable)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  AsmJsVarBase *this_00;
  PropertyId local_3c;
  AsmJsVarBase *local_38;
  
  local_38 = FindVar(this,name);
  if (local_38 == (AsmJsVarBase *)0x0) {
    if (isArg) {
      if (!isMutable) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                    ,0x2ef,"(isMutable)","isMutable");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      this_00 = (AsmJsVarBase *)
                new<Memory::ArenaAllocator>
                          (0x20,(this->super_AsmJsFunctionDeclaration).mAllocator,0x366bee);
      AsmJsVarBase::AsmJsVarBase(this_00,name,Argument,true);
      (this_00->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014feed0;
    }
    else {
      this_00 = (AsmJsVarBase *)
                new<Memory::ArenaAllocator>
                          (0x28,(this->super_AsmJsFunctionDeclaration).mAllocator,0x366bee);
      AsmJsVarBase::AsmJsVarBase(this_00,name,Variable,isMutable);
      (this_00->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014feac8;
      this_00[1].super_AsmJsSymbol._vptr_AsmJsSymbol = (_func_int **)0x0;
    }
    local_3c = name->m_propertyId;
    local_38 = this_00;
    iVar3 = JsUtil::
            BaseDictionary<int,Js::AsmJsVarBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<int,Js::AsmJsVarBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                      ((BaseDictionary<int,Js::AsmJsVarBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->mVarMap,&local_3c,&local_38);
    if (iVar3 != -1) {
      return local_38;
    }
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&((this->super_AsmJsFunctionDeclaration).mAllocator)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,local_38,
               (ulong)!isArg * 8 + 0x20);
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,AsmjsPhase);
    if (bVar2) {
      Output::Print(L"Variable redefinition: %s\n",&name->field_0x22);
      return (AsmJsVarBase *)0x0;
    }
  }
  return (AsmJsVarBase *)0x0;
}

Assistant:

AsmJsVarBase* AsmJsFunc::DefineVar( PropertyName name, bool isArg /*= false*/, bool isMutable /*= true*/ )
    {
        AsmJsVarBase* var = FindVar(name);
        if (var)
        {
            if (PHASE_TRACE1(AsmjsPhase))
            {
                Output::Print(_u("Variable redefinition: %s\n"), name->Psz());
            }
            return nullptr;
        }

        if (isArg)
        {
            // arg cannot be const
            Assert(isMutable);
            var = Anew( mAllocator, AsmJsArgument, name );
        }
        else
        {
            var = Anew(mAllocator, AsmJsVar, name, isMutable);
        }
        int addResult = mVarMap.AddNew(name->GetPropertyId(), var);
        if( addResult == -1 )
        {
            mAllocator->Free(var, isArg ? sizeof(AsmJsArgument) : sizeof(AsmJsVar));
            return nullptr;
        }
        return var;
    }